

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  byte bVar1;
  undefined2 uVar2;
  byte bVar3;
  ulong uVar4;
  checked_ptr<typename_buffer<char>::value_type> pcVar5;
  char __tmp;
  ulong n;
  size_t __len;
  size_t __n;
  size_t __len_1;
  checked_ptr<typename_buffer<char>::value_type> pcVar6;
  
  n = (ulong)(uint)specs->width;
  uVar4 = 4 - (ulong)(f->sign == none);
  __n = n - uVar4;
  if (n < uVar4 || __n == 0) {
    pcVar5 = reserve<fmt::v6::internal::buffer<char>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,uVar4);
    if ((ulong)f->sign != 0) {
      *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar5 = pcVar5 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar2;
    return;
  }
  pcVar5 = reserve<fmt::v6::internal::buffer<char>,_0>
                     ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,n);
  bVar1 = (specs->fill).data_[0];
  bVar3 = specs->field_0x9 & 0xf;
  if (bVar3 == 3) {
    uVar4 = __n >> 1 & 0x7fffffff;
    if (1 < __n) {
      memset(pcVar5,(uint)bVar1,uVar4);
      pcVar5 = pcVar5 + uVar4;
    }
    if ((ulong)f->sign != 0) {
      *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar5 = pcVar5 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar2;
    __n = __n - uVar4;
  }
  else {
    if (bVar3 == 2) {
      pcVar6 = pcVar5 + __n;
      memset(pcVar5,(uint)bVar1,__n);
      if ((ulong)f->sign != 0) {
        *pcVar6 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
        pcVar6 = pcVar6 + 1;
      }
      uVar2 = *(undefined2 *)f->str;
      pcVar6[2] = f->str[2];
      *(undefined2 *)pcVar6 = uVar2;
      return;
    }
    if ((ulong)f->sign != 0) {
      *pcVar5 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar5 = pcVar5 + 1;
    }
    uVar2 = *(undefined2 *)f->str;
    pcVar5[2] = f->str[2];
    *(undefined2 *)pcVar5 = uVar2;
  }
  memset(pcVar5 + 3,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }